

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.c
# Opt level: O1

int snprintf_error_data(char *buf,size_t len,uint8_t err,char **arr,int arr_len)

{
  bool bVar1;
  uint uVar2;
  undefined7 in_register_00000011;
  ulong uVar3;
  ulong uVar4;
  int unaff_R12D;
  int iVar5;
  int iVar6;
  
  iVar5 = 0;
  if (0 < arr_len && (len != 0 && (int)CONCAT71(in_register_00000011,err) != 0)) {
    uVar3 = 0;
    iVar6 = 0;
    iVar5 = 0;
    do {
      if ((err >> ((uint)uVar3 & 0x1f) & 1) != 0) {
        if (iVar6 == 0) {
LAB_001051cc:
          uVar4 = len - (long)iVar5;
          uVar2 = snprintf(buf + iVar5,uVar4,"%s",arr[uVar3]);
          if (uVar4 <= uVar2 || (int)uVar2 < 0) goto LAB_0010521c;
          iVar5 = iVar5 + uVar2;
          iVar6 = iVar6 + 1;
          bVar1 = true;
        }
        else {
          uVar4 = len - (long)iVar5;
          uVar2 = snprintf(buf + iVar5,uVar4,",");
          if (uVar2 < uVar4 && -1 < (int)uVar2) {
            iVar5 = iVar5 + uVar2;
            goto LAB_001051cc;
          }
LAB_0010521c:
          bVar1 = false;
          unaff_R12D = iVar5;
        }
        if (!bVar1) {
          return unaff_R12D;
        }
      }
      uVar3 = uVar3 + 1;
    } while ((uint)arr_len != uVar3);
  }
  return iVar5;
}

Assistant:

static int snprintf_error_data(char *buf, size_t len, uint8_t err,
			       const char **arr, int arr_len)
{
	int i, n = 0, count = 0;

	if (!err || len <= 0)
		return 0;

	for (i = 0; i < arr_len; i++) {
		if (err & (1 << i)) {
			int tmp_n = 0;
			if (count) {
				/* Fix for potential buffer overflow https://lgtm.com/rules/1505913226124/ */
				tmp_n = snprintf(buf + n, len - n, ",");
				if (tmp_n < 0 || (size_t)tmp_n >= len - n) {
					return n;
				}
				n += tmp_n;
			}
			tmp_n = snprintf(buf + n, len - n, "%s", arr[i]);
			if (tmp_n < 0 || (size_t)tmp_n >= len - n) {
				return n;
			}
			n += tmp_n;
			count++;
		}
	}

	return n;
}